

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O2

size_t tt::detail::convert<long_long>(char *buf,longlong value)

{
  longlong lVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  
  lVar1 = value;
  pcVar4 = buf;
  do {
    pcVar3 = pcVar4;
    *pcVar3 = *(char *)(zero + lVar1 % 10);
    pcVar4 = pcVar3 + 1;
    uVar2 = lVar1 + 9;
    lVar1 = lVar1 / 10;
  } while (0x12 < uVar2);
  if (value != 0) {
    *pcVar4 = '-';
    pcVar4 = pcVar3 + 2;
  }
  *pcVar4 = '\0';
  std::__reverse<char*>(buf,pcVar4);
  return (long)pcVar4 - (long)buf;
}

Assistant:

size_t convert(char buf[],T value){ //将数值转换为字符串
	T i = value;
	char* p = buf;

	do{
		int lsd = static_cast<int>(i % 10);
		i /= 10;
		*p++ = zero[lsd];
		
	}while(i != 0);

	if(value << 0){
		*p++ = '-';
	}

	*p = '\0';

	std::reverse(buf,p);

	return p - buf;
}